

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Descriptor.cpp
# Opt level: O3

TypeDescriptor * multOperator(TypeDescriptor *leftValue,TypeDescriptor *rightValue)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  NumberDescriptor *this;
  StringDescriptor *this_00;
  ostream *poVar3;
  int iVar4;
  double dVar5;
  string finalValue;
  string stringValue;
  string local_78;
  char *local_58;
  long local_50;
  char local_48;
  undefined7 uStack_47;
  double local_38;
  
  if (leftValue->_type == STRING) {
    if (rightValue->_type == STRING) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"TypeDescriptor *multOperator: ",0x1e);
      pcVar2 = (leftValue->_string)._M_dataplus._M_p;
      local_58 = &local_48;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,pcVar2,pcVar2 + (leftValue->_string)._M_string_length);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_58,local_50);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," * ",3);
      paVar1 = &local_78.field_2;
      pcVar2 = (rightValue->_string)._M_dataplus._M_p;
      local_78._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_78,pcVar2,pcVar2 + (rightValue->_string)._M_string_length);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,local_78._M_dataplus._M_p,local_78._M_string_length);
      std::endl<char,std::char_traits<char>>(poVar3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar1) {
        operator_delete(local_78._M_dataplus._M_p,
                        CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                                 local_78.field_2._M_local_buf[0]) + 1);
      }
      if (local_58 != &local_48) {
        operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Cannot multiply:",0x10);
      pcVar2 = (leftValue->_string)._M_dataplus._M_p;
      local_58 = &local_48;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,pcVar2,pcVar2 + (leftValue->_string)._M_string_length);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_58,local_50);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," * ",3);
      pcVar2 = (rightValue->_string)._M_dataplus._M_p;
      local_78._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_78,pcVar2,pcVar2 + (rightValue->_string)._M_string_length);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,local_78._M_dataplus._M_p,local_78._M_string_length);
      std::endl<char,std::char_traits<char>>(poVar3);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_58);
      goto LAB_00114a0d;
    }
  }
  else if ((leftValue->_type == NUMBER) && (rightValue->_type == NUMBER)) {
    this = (NumberDescriptor *)operator_new(0x60);
    NumberDescriptor::NumberDescriptor(this,leftValue->_number * rightValue->_number);
    return &this->super_TypeDescriptor;
  }
  dVar5 = fmod(leftValue->_number,1.0);
  if ((dVar5 != 0.0) || (NAN(dVar5))) {
    dVar5 = fmod(rightValue->_number,1.0);
    if ((dVar5 != 0.0) || (NAN(dVar5))) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Unknown type. Terminating...");
      std::endl<char,std::char_traits<char>>(poVar3);
LAB_00114a0d:
      exit(2);
    }
  }
  local_50 = 0;
  local_48 = '\0';
  local_58 = &local_48;
  if (leftValue->_type == NUMBER) {
    local_38 = leftValue->_number;
    pcVar2 = (rightValue->_string)._M_dataplus._M_p;
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,pcVar2,pcVar2 + (rightValue->_string)._M_string_length);
    std::__cxx11::string::operator=((string *)&local_58,(string *)&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p == &local_78.field_2) goto LAB_00114796;
  }
  else {
    local_38 = rightValue->_number;
    pcVar2 = (leftValue->_string)._M_dataplus._M_p;
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,pcVar2,pcVar2 + (leftValue->_string)._M_string_length);
    std::__cxx11::string::operator=((string *)&local_58,(string *)&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p == &local_78.field_2) goto LAB_00114796;
  }
  operator_delete(local_78._M_dataplus._M_p,
                  CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                           local_78.field_2._M_local_buf[0]) + 1);
LAB_00114796:
  paVar1 = &local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  local_78._M_dataplus._M_p = (pointer)paVar1;
  if (0.0 < local_38) {
    iVar4 = 1;
    do {
      std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_58);
      dVar5 = (double)iVar4;
      iVar4 = iVar4 + 1;
    } while (dVar5 < local_38);
  }
  this_00 = (StringDescriptor *)operator_new(0x78);
  StringDescriptor::StringDescriptor(this_00,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]) + 1);
  }
  if (local_58 != &local_48) {
    operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
  }
  return &this_00->super_TypeDescriptor;
}

Assistant:

TypeDescriptor *multOperator(TypeDescriptor *leftValue, TypeDescriptor *rightValue){
    if(leftValue->type() == TypeDescriptor::NUMBER
    && rightValue->type() == TypeDescriptor::NUMBER){
        auto *numProduct = new  NumberDescriptor(leftValue->getNumber() * rightValue->getNumber());
        //std::cout << "TypeDescriptor *multOperator: " << leftValue->getNumber() << " * " << rightValue->getNumber() << std::endl;
        return numProduct;
    }else if(leftValue->type() == TypeDescriptor::STRING
    && rightValue->type() == TypeDescriptor::STRING){
        std::cout << "TypeDescriptor *multOperator: " << leftValue->getString()  << " * " << rightValue->getString()  << std::endl;
        std::cout << "Cannot multiply:" << leftValue->getString()  << " * " << rightValue->getString()  << std::endl;
        exit(2);
    }else{
        if(std::fmod(leftValue->getNumber(),1) == 0
        ||std::fmod(rightValue->getNumber(),1) == 0){
            double range = 0;
            std::string stringValue;
            if(leftValue->type() == TypeDescriptor::NUMBER){
                range = leftValue->getNumber();
                stringValue = rightValue->getString();
            }
            else{
                range = rightValue->getNumber();
                stringValue = leftValue->getString();
            }
            std::string finalValue;
            for(int i = 0; i < range; i++){
                finalValue += stringValue;
            }
            auto *stringProduct = new StringDescriptor(finalValue);
            return stringProduct;
        }
        else{
            std::cout << "Unknown type. Terminating..." << std::endl;
            exit(2);
        }
    }
}